

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hyperplane.cpp
# Opt level: O0

void base_case_new_coord_calculation
               (int ndims,int my_rank,int my_partition,int p_node,int *grid_points,
               int *new_rank_coords,int *dimension_order)

{
  int iVar1;
  int iVar2;
  int index;
  int d;
  int span;
  int my_difference;
  int d_1;
  int *new_rank_coords_local;
  int *grid_points_local;
  int p_node_local;
  int my_partition_local;
  int my_rank_local;
  int ndims_local;
  
  for (d_1 = 0; d_1 < ndims; d_1 = d_1 + 1) {
    new_rank_coords[d_1] = grid_points[d_1 << 1];
  }
  my_difference = my_rank - my_partition * p_node;
  for (index = ndims + -1; -1 < index; index = index + -1) {
    iVar1 = dimension_order[index];
    iVar2 = (grid_points[iVar1 * 2 + 1] - grid_points[iVar1 << 1]) + 1;
    new_rank_coords[iVar1] = my_difference % iVar2 + new_rank_coords[iVar1];
    my_difference = my_difference / iVar2;
  }
  return;
}

Assistant:

void base_case_new_coord_calculation(const int ndims,
					 const int my_rank,
					 const int my_partition,
					 const int p_node,
					 const int *const grid_points,
					 int *const new_rank_coords,
					 const int *const dimension_order) {
  for (int d = 0; d < ndims; d++) {
	new_rank_coords[d] = grid_points[2 * d];
  }

  int my_difference = my_rank - my_partition * p_node;
  int span, d;

  //Idea, fill up the the partitions s.t. if the grid size
  //is 2*p_node, the best split between the two is done
  //according to the ranks
  for (int index = ndims - 1; index >= 0; index--) {
	d = dimension_order[index];
	span = (grid_points[2 * d + 1] - grid_points[2 * d]) + 1;
	new_rank_coords[d] += my_difference % span;
	my_difference /= span;
  }
}